

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_manager_impl.c
# Opt level: O2

void loader_manager_impl_script_paths_destroy(vector script_paths)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  
  lVar1 = vector_size();
  for (lVar3 = 0; lVar1 != lVar3; lVar3 = lVar3 + 1) {
    puVar2 = (undefined8 *)vector_at(script_paths,lVar3);
    free((void *)*puVar2);
  }
  vector_destroy(script_paths);
  return;
}

Assistant:

void loader_manager_impl_script_paths_destroy(vector script_paths)
{
	size_t iterator, size = vector_size(script_paths);

	for (iterator = 0; iterator < size; ++iterator)
	{
		char *path = vector_at_type(script_paths, iterator, char *);

		free(path);
	}

	vector_destroy(script_paths);
}